

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.h
# Opt level: O2

int CG<TPZMatrix<float>,TPZFMatrix<float>,TPZMatrixSolver<float>,double>
              (TPZMatrix<float> *A,TPZFMatrix<float> *x,TPZFMatrix<float> *b,
              TPZMatrixSolver<float> *M,TPZFMatrix<float> *residual,int64_t *max_iter,double *tol,
              int FromCurrent)

{
  double dVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  TPZFMatrix<float> *this;
  float fVar5;
  float fVar6;
  double local_298;
  TPZFMatrix<float> q;
  TPZFMatrix<float> z;
  TPZFMatrix<float> p;
  TPZFMatrix<float> resbackup;
  
  TPZFMatrix<float>::TPZFMatrix(&p);
  TPZFMatrix<float>::TPZFMatrix(&z);
  TPZFMatrix<float>::TPZFMatrix(&q);
  fVar5 = Norm(b);
  TPZFMatrix<float>::TPZFMatrix(&resbackup);
  this = &resbackup;
  if (residual != (TPZFMatrix<float> *)0x0) {
    this = residual;
  }
  if (FromCurrent == 0) {
    (*(x->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])();
    TPZFMatrix<float>::operator=(this,b);
  }
  else {
    (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])
              (0xbf800000,0x3f800000,A,x,b,this,0);
  }
  local_298 = (double)fVar5;
  if ((fVar5 == 0.0) && (!NAN(fVar5))) {
    local_298 = 1.0;
  }
  fVar5 = Norm(this);
  dVar1 = (double)fVar5 / local_298;
  if (dVar1 <= *tol) {
    lVar4 = 0;
LAB_00d1625a:
    iVar3 = 0;
    *tol = dVar1;
    *max_iter = lVar4;
  }
  else {
    fVar5 = 0.0;
    for (lVar4 = 1; lVar4 <= *max_iter; lVar4 = lVar4 + 1) {
      (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,this,&z,0);
      fVar6 = Dot<float>(this,&z);
      if (lVar4 == 1) {
        TPZFMatrix<float>::operator=(&p,&z);
      }
      else {
        TPZFMatrix<float>::TimesBetaPlusZ(&p,fVar6 / fVar5,&z);
      }
      (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,&p,&q);
      fVar5 = Dot<float>(&p,&q);
      TPZFMatrix<float>::ZAXPY(x,fVar6 / fVar5,&p);
      TPZFMatrix<float>::ZAXPY(this,-(fVar6 / fVar5),&q);
      fVar5 = Norm(this);
      dVar1 = (double)fVar5 / local_298;
      if (dVar1 <= *tol) goto LAB_00d1625a;
      fVar5 = fVar6;
    }
    *tol = dVar1;
    poVar2 = std::operator<<((ostream *)&std::cout,"cg iter = ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2," res = ");
    poVar2 = std::ostream::_M_insert<double>(dVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = 1;
  }
  TPZFMatrix<float>::~TPZFMatrix(&resbackup);
  TPZFMatrix<float>::~TPZFMatrix(&q);
  TPZFMatrix<float>::~TPZFMatrix(&z);
  TPZFMatrix<float>::~TPZFMatrix(&p);
  return iVar3;
}

Assistant:

int
CG( Matrix &A, Vector &x, const Vector &b,
   Preconditioner &M, Vector *residual, int64_t &max_iter, Real &tol,const int FromCurrent)
{
	Real resid;
	Vector p, z, q;
	REAL alpha, beta, rho, rho_1 = 0;
	
    REAL normb = TPZExtractVal::val(Norm(b));
	Vector resbackup;
	Vector *res = residual;
	
#ifdef TEST
	std::list< TPZFMatrix<REAL> > plist,qlist;
	std::list< TPZFMatrix<REAL> >::iterator jt;
	std::list< TPZFMatrix<REAL> >::iterator kt;
	Vector Au;
#endif
	
	if(!res) res = &resbackup;
	Vector &r = *res;
	//  Vector r = b - A*x;
	if(FromCurrent) 
    {
        A.MultAdd(x,b,r,-1.,1.);
    }
	else {
		x.Zero();
		r = b;
	}
	
	if (normb == 0.0)
		normb = 1.0;
	
    if ((resid = (TPZExtractVal::val( Norm(r) ) ) / normb) <= tol) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	int64_t i;
	for (i = 1; i <= max_iter; i++) {
		M.Solve(r,z);
        rho = TPZExtractVal::val(Dot(r, z));
		
		if (i == 1)
			p = z;
		else {
			beta = rho / rho_1;
			p.TimesBetaPlusZ(beta,z);
		}
#ifdef TEST
		
		plist.push_back(p);
#endif	 
		
		A.Multiply(p,q);
		alpha = rho / (TPZExtractVal::val(Dot(p, q)));
		
#ifdef TEST
		qlist.push_back(q);
#endif
		
		x.ZAXPY(alpha,p);
		r.ZAXPY(-alpha,q);
		
#ifdef TEST
		A.Multiply(x,Au);
		REAL energy = Dot(x,Au)/2.-Dot(x,b);
#endif
		
		if ((resid = (TPZExtractVal::val(Norm(r))) / normb) <= tol) {
			tol = resid;
			max_iter = i;
#ifdef PZDEBUG
			std::cout << "cg iter = " << i <<  " res = " << resid << std::endl;
#endif
			return 0;
		}
#ifdef PZDEBUG
		std::cout << "cg iter = " << i <<  " res = " << resid /*<< " energy " << energy */ << std::endl;
#endif
#ifdef TEST
		std::cout << " energy " << energy << std::endl;
		TPZFMatrix<REAL> inner(plist.size(),plist.size(),0.);
		{
			int64_t j,k;
			for(j=0, jt = plist.begin(); jt != plist.end(); jt++,j++)
			{
				for(k=0, kt = qlist.begin(); kt != qlist.end(); kt++,k++)
				{
					inner(j,k) = Dot((*jt),(*kt));
				}
			}
		}
		inner.Print("Inner product of search directions");
#endif
		rho_1 = rho;
	}
	
	tol = resid;
	std::cout << "cg iter = " << i <<  " res = " << resid << std::endl;
	return 1;
}